

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

size_t __thiscall
CoreML::Specification::LayerNormalizationLayerParams::ByteSizeLong
          (LayerNormalizationLayerParams *this)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  ulong *puVar4;
  size_t sVar5;
  long lVar6;
  int index;
  ulong uVar7;
  size_t sVar8;
  
  iVar1 = (this->normalizedshape_).current_size_;
  index = 0;
  if (iVar1 < 1) {
    lVar6 = 0;
  }
  else {
    lVar6 = 0;
    do {
      puVar4 = (ulong *)google::protobuf::RepeatedField<long>::Get(&this->normalizedshape_,index);
      lVar2 = 0x3f;
      if ((*puVar4 | 1) != 0) {
        for (; (*puVar4 | 1) >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      lVar6 = lVar6 + (ulong)((int)lVar2 * 9 + 0x49U >> 6);
      index = index + 1;
    } while (iVar1 != index);
  }
  uVar3 = (uint)lVar6;
  if (lVar6 == 0) {
    uVar7 = 0;
  }
  else if ((int)uVar3 < 0) {
    uVar7 = 0xb;
  }
  else {
    iVar1 = 0x1f;
    if ((uVar3 | 1) != 0) {
      for (; (uVar3 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    uVar7 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 1);
  }
  this->_normalizedshape_cached_byte_size_ = uVar3;
  sVar8 = uVar7 + lVar6;
  if (this->gamma_ != (WeightParams *)0x0 &&
      this != (LayerNormalizationLayerParams *)&_LayerNormalizationLayerParams_default_instance_) {
    sVar5 = WeightParams::ByteSizeLong(this->gamma_);
    uVar3 = (uint)sVar5 | 1;
    iVar1 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar8 = sVar8 + sVar5 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
  }
  if (this->beta_ != (WeightParams *)0x0 &&
      this != (LayerNormalizationLayerParams *)&_LayerNormalizationLayerParams_default_instance_) {
    sVar5 = WeightParams::ByteSizeLong(this->beta_);
    uVar3 = (uint)sVar5 | 1;
    iVar1 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar8 = sVar8 + sVar5 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
  }
  sVar5 = sVar8;
  if (this->eps_ != 0.0) {
    sVar5 = sVar8 + 5;
  }
  if (NAN(this->eps_)) {
    sVar5 = sVar8 + 5;
  }
  this->_cached_size_ = (int)sVar5;
  return sVar5;
}

Assistant:

size_t LayerNormalizationLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.LayerNormalizationLayerParams)
  size_t total_size = 0;

  // repeated int64 normalizedShape = 1;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      Int64Size(this->normalizedshape_);
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _normalizedshape_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // .CoreML.Specification.WeightParams gamma = 3;
  if (this->has_gamma()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->gamma_);
  }

  // .CoreML.Specification.WeightParams beta = 4;
  if (this->has_beta()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->beta_);
  }

  // float eps = 2;
  if (this->eps() != 0) {
    total_size += 1 + 4;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}